

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void simd::ConvertToRgb(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                       uint32_t startYOut,uint32_t width,uint32_t height,SIMDType simdType)

{
  undefined1 *puVar1;
  undefined1 auVar2 [16];
  undefined1 uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 *puVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  SIMDType SVar13;
  undefined1 (*pauVar14) [16];
  undefined1 (*pauVar15) [16];
  undefined1 *puVar16;
  undefined1 (*pauVar17) [16];
  uint uVar18;
  uint uVar19;
  undefined1 (*pauVar20) [16];
  undefined2 *puVar21;
  
  do {
    SVar13 = simdType;
    simdType = sse_function;
  } while (SVar13 == avx_function);
  if (SVar13 - sse_function < 2) {
    uVar18 = (uint)(SVar13 != neon_function) * 8 + 8;
    if (width < uVar18) {
LAB_0012480f:
      Image_Function::ConvertToRgb(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
      return;
    }
  }
  else {
    if (SVar13 == cpu_function) goto LAB_0012480f;
    uVar18 = 0;
  }
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  Image_Function::VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(out);
  auVar12 = _DAT_001db4f0;
  auVar11 = _DAT_001db4e0;
  auVar10 = _DAT_001db4d0;
  if (in->_colorCount == '\x03') {
    Image_Function::Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  }
  else if (SVar13 == sse_function) {
    uVar4 = out->_rowSize;
    if (height * uVar4 != 0) {
      uVar5 = in->_rowSize;
      pauVar14 = (undefined1 (*) [16])
                 (out->_data + (ulong)(startXOut * 3) + (ulong)(startYOut * uVar4));
      puVar9 = *pauVar14;
      uVar6 = (ulong)width / (ulong)uVar18;
      uVar19 = uVar18 * (int)uVar6;
      pauVar15 = (undefined1 (*) [16])(in->_data + (ulong)startXIn + (ulong)(startYIn * uVar5));
      do {
        pauVar17 = pauVar15;
        pauVar20 = pauVar14;
        do {
          auVar2 = *pauVar17;
          pauVar17 = pauVar17 + 1;
          auVar7 = vpshufb_avx(auVar2,auVar10);
          auVar8 = vpshufb_avx(auVar2,auVar11);
          auVar2 = vpshufb_avx(auVar2,auVar12);
          *pauVar20 = auVar7;
          pauVar20[1] = auVar8;
          pauVar20[2] = auVar2;
          pauVar20 = pauVar20 + 3;
        } while (pauVar17 != pauVar15 + uVar6);
        if (uVar19 != width) {
          puVar16 = *pauVar15 + uVar19;
          puVar21 = (undefined2 *)(*pauVar14 + uVar19 * 3);
          puVar1 = puVar16 + (ulong)width % (ulong)uVar18;
          do {
            uVar3 = *puVar16;
            puVar16 = puVar16 + 1;
            *(undefined1 *)(puVar21 + 1) = uVar3;
            *puVar21 = CONCAT11(uVar3,uVar3);
            puVar21 = (undefined2 *)((long)puVar21 + 3);
          } while (puVar16 != puVar1);
        }
        pauVar14 = (undefined1 (*) [16])(*pauVar14 + uVar4);
        pauVar15 = (undefined1 (*) [16])(*pauVar15 + uVar5);
      } while (pauVar14 != (undefined1 (*) [16])(puVar9 + height * uVar4));
    }
  }
  return;
}

Assistant:

void ConvertToRgb( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                       uint32_t width, uint32_t height, SIMDType simdType )
    {
        uint32_t simdSize = getSimdSize( simdType );
        if( simdType == neon_function ) // for neon, because the algorithm used work with packet of 64 bit
            simdSize = 8u;
        
        const uint8_t colorCount = RGB;

        if( (simdType == cpu_function) || (simdType == avx_function) || (width < simdSize) ) {
            AVX_CODE( ConvertToRgb( in, startXIn, startYIn, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::ConvertToRgb( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyRGBImage     ( out );

        if( in.colorCount() == RGB ) {
            Image_Function::Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        SSSE3_CODE( sse::ConvertToRgb( outY, outYEnd, inY, rowSizeOut, rowSizeIn, colorCount, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::ConvertToRgb( outY, outYEnd, inY, rowSizeOut, rowSizeIn, colorCount, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }